

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<unsigned_short> * __thiscall
std::experimental::optional<unsigned_short>::operator=
          (optional<unsigned_short> *this,optional<unsigned_short> *rhs)

{
  unsigned_short uVar1;
  bool bVar2;
  unsigned_short *puVar3;
  optional<unsigned_short> *rhs_local;
  optional<unsigned_short> *this_local;
  
  bVar2 = initialized(this);
  if ((!bVar2) || (bVar2 = initialized(rhs), bVar2)) {
    bVar2 = initialized(this);
    if ((bVar2) || (bVar2 = initialized(rhs), !bVar2)) {
      bVar2 = initialized(this);
      if ((bVar2) && (bVar2 = initialized(rhs), bVar2)) {
        puVar3 = operator*(rhs);
        uVar1 = *puVar3;
        puVar3 = contained_val(this);
        *puVar3 = uVar1;
      }
    }
    else {
      puVar3 = operator*(rhs);
      initialize<unsigned_short>(this,puVar3);
    }
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

optional& operator=(optional&& rhs)
  noexcept(is_nothrow_move_assignable<T>::value && is_nothrow_move_constructible<T>::value)
  {
    if      (initialized() == true  && rhs.initialized() == false) clear();
    else if (initialized() == false && rhs.initialized() == true)  initialize(std::move(*rhs));
    else if (initialized() == true  && rhs.initialized() == true)  contained_val() = std::move(*rhs);
    return *this;
  }